

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sha512h2_arm(void *vd,void *vn,void *vm)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t d1;
  uint64_t d0;
  uint64_t *rm;
  uint64_t *rn;
  uint64_t *rd;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  lVar1 = *vd;
  lVar2 = *(long *)((long)vd + 8);
  uVar3 = S0_512(*vm);
  uVar4 = maj512(*vn,*(uint64_t *)((long)vm + 8),*vm);
  uVar3 = uVar3 + uVar4 + lVar2;
  uVar4 = S0_512(uVar3);
  uVar5 = maj512(uVar3,*vm,*(uint64_t *)((long)vm + 8));
  *(uint64_t *)vd = uVar4 + uVar5 + lVar1;
  *(uint64_t *)((long)vd + 8) = uVar3;
  return;
}

Assistant:

void HELPER(crypto_sha512h2)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    uint64_t d0 = rd[0];
    uint64_t d1 = rd[1];

    d1 += S0_512(rm[0]) + maj512(rn[0], rm[1], rm[0]);
    d0 += S0_512(d1) + maj512(d1, rm[0], rm[1]);

    rd[0] = d0;
    rd[1] = d1;
}